

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>
               *this,int i)

{
  double dVar1;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *pFVar2;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *pFVar3;
  Fad<double> *pFVar4;
  Fad<double> *pFVar5;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  *pFVar6;
  Fad<double> *pFVar7;
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *pFVar8;
  Fad<double> *pFVar9;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar10;
  Fad<double> *pFVar11;
  double dVar12;
  double dVar13;
  
  pFVar2 = (this->left_->fadexpr_).left_;
  pFVar3 = (this->left_->fadexpr_).right_;
  pFVar4 = (pFVar2->fadexpr_).right_;
  pFVar5 = (pFVar3->fadexpr_).right_;
  dVar13 = (pFVar3->fadexpr_).left_.constant_ + pFVar5->val_;
  dVar12 = (pFVar2->fadexpr_).left_.constant_ + pFVar4->val_;
  pFVar6 = (this->right_->fadexpr_).left_;
  pFVar7 = (this->right_->fadexpr_).right_;
  pFVar8 = (pFVar6->fadexpr_).left_;
  pFVar9 = (pFVar8->fadexpr_).right_;
  pFVar10 = (pFVar6->fadexpr_).right_;
  dVar1 = (pFVar10->fadexpr_).left_.constant_;
  pFVar11 = (pFVar10->fadexpr_).right_;
  return dVar12 * dVar13 *
         ((-(pFVar9->dx_).ptr_to_data[i] - dVar1 * (pFVar11->dx_).ptr_to_data[i]) +
         (pFVar7->dx_).ptr_to_data[i]) +
         ((((pFVar8->fadexpr_).left_.constant_ - pFVar9->val_) - pFVar11->val_ * dVar1) +
         pFVar7->val_) *
         ((pFVar4->dx_).ptr_to_data[i] * dVar13 + (pFVar5->dx_).ptr_to_data[i] * dVar12);
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}